

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<long_double> * __thiscall
TPZVec<long_double>::operator=(TPZVec<long_double> *this,TPZVec<long_double> *copy)

{
  int64_t iVar1;
  TPZVec<long_double> *in_RSI;
  TPZVec<long_double> *in_RDI;
  int64_t i;
  long local_18;
  
  if (in_RDI != in_RSI) {
    iVar1 = NElements(in_RSI);
    (*in_RDI->_vptr_TPZVec[3])(in_RDI,iVar1);
    for (local_18 = 0; local_18 < in_RSI->fNElements; local_18 = local_18 + 1) {
      in_RDI->fStore[local_18] = in_RSI->fStore[local_18];
    }
  }
  return in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}